

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  size_t sVar3;
  Allocator *pAVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  int *piVar8;
  long *plVar9;
  Layer *pLVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  float fVar24;
  int *out;
  ParamDict pd;
  ulong local_5d8;
  int *piStack_5d0;
  long local_5c8;
  Allocator *local_5c0;
  undefined4 local_5b8;
  int local_5b4;
  int local_5b0;
  uint local_5ac;
  ulong local_5a8;
  Mat local_598;
  ulong local_560;
  void *local_558;
  ModelBinFromMatArray local_550;
  ParamDict local_540;
  
  iVar16 = bottom_blob->w;
  iVar22 = bottom_blob->h;
  uVar2 = bottom_blob->c;
  sVar3 = bottom_blob->elemsize;
  iVar21 = this->num_output;
  pAVar4 = opt->blob_allocator;
  if ((((top_blob->dims == 1) && (top_blob->w == iVar21)) && (top_blob->elemsize == sVar3)) &&
     (top_blob->allocator == pAVar4)) {
    pvVar13 = top_blob->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
  }
  else {
    piVar8 = top_blob->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 8))();
        }
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = sVar3;
    top_blob->allocator = pAVar4;
    top_blob->dims = 1;
    top_blob->w = iVar21;
    top_blob->h = 1;
    top_blob->c = 1;
    top_blob->cstep = (long)iVar21;
    if (iVar21 == 0) {
      return -100;
    }
    uVar23 = sVar3 * (long)iVar21 + 3 & 0xfffffffffffffffc;
    if (pAVar4 == (Allocator *)0x0) {
      pvVar11 = malloc(uVar23 + 0x1c);
      pvVar13 = (void *)((long)pvVar11 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar13 - 8) = pvVar11;
    }
    else {
      pvVar13 = (void *)(*(code *)**(undefined8 **)pAVar4)(pAVar4,uVar23 + 4);
    }
    top_blob->data = pvVar13;
    top_blob->refcount = (int *)((long)pvVar13 + uVar23);
    *(undefined4 *)((long)pvVar13 + uVar23) = 1;
  }
  if ((long)top_blob->c * top_blob->cstep != 0) {
    uVar20 = iVar22 * iVar16;
    if (this->use_int8_inference == false) {
      iVar16 = this->num_output;
      if (0 < (long)iVar16) {
        iVar22 = this->bias_term;
        pvVar11 = (this->bias_data).data;
        pvVar5 = (this->weight_data).data;
        pvVar6 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        sVar7 = bottom_blob->elemsize;
        iVar21 = 0;
        lVar12 = 0;
        do {
          if (iVar22 == 0) {
            fVar24 = 0.0;
          }
          else {
            fVar24 = *(float *)((long)pvVar11 + lVar12 * 4);
          }
          if (0 < (int)uVar2) {
            pvVar18 = (void *)((long)pvVar5 + (long)iVar21 * 4);
            uVar23 = 0;
            pvVar15 = pvVar6;
            do {
              if (0 < (int)uVar20) {
                uVar19 = 0;
                do {
                  fVar24 = fVar24 + *(float *)((long)pvVar18 + uVar19 * 4) *
                                    *(float *)((long)pvVar15 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
              uVar23 = uVar23 + 1;
              pvVar18 = (void *)((long)pvVar18 + (long)(int)uVar20 * 4);
              pvVar15 = (void *)((long)pvVar15 + sVar3 * sVar7);
            } while (uVar23 != uVar2);
          }
          *(float *)((long)pvVar13 + lVar12 * 4) = fVar24;
          lVar12 = lVar12 + 1;
          iVar21 = iVar21 + uVar20 * uVar2;
        } while (lVar12 != iVar16);
      }
      return 0;
    }
    local_5c0 = opt->workspace_allocator;
    local_5d8 = 0;
    piStack_5d0 = (int *)0x0;
    local_5c8 = 1;
    local_5b8 = 3;
    uVar23 = (long)(int)uVar20 + 0xfU & 0xfffffffffffffff0;
    lVar12 = (long)(int)uVar2 * uVar23;
    if (lVar12 != 0) {
      local_5b4 = iVar16;
      local_5b0 = iVar22;
      local_5ac = uVar2;
      local_5a8 = uVar23;
      if (local_5c0 == (Allocator *)0x0) {
        pvVar13 = malloc(lVar12 + 0x1c);
        local_5d8 = (long)pvVar13 + 0x17U & 0xfffffffffffffff0;
        *(void **)(local_5d8 - 8) = pvVar13;
      }
      else {
        local_5d8 = (*(code *)**(undefined8 **)local_5c0)();
        uVar23 = local_5a8;
      }
      piStack_5d0 = (int *)(local_5d8 + lVar12);
      *(undefined4 *)(local_5d8 + lVar12) = 1;
      if ((long)(int)local_5ac * uVar23 == 0) {
        iVar16 = -100;
      }
      else {
        ParamDict::ParamDict(&local_540);
        ParamDict::set(&local_540,0,this->bottom_blob_int8_scale);
        (*this->quantize->_vptr_Layer[2])(this->quantize,&local_540);
        (*this->quantize->_vptr_Layer[5])(this->quantize,bottom_blob,&local_5d8);
        lVar12 = 0x4d8;
        do {
          piVar8 = *(int **)((long)(local_540.params + -1) + 0x38 + lVar12);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              lVar17 = *(long *)((long)local_540.params + lVar12 + -0x10);
              plVar9 = *(long **)((long)&local_540.params[0].v.data + lVar12);
              if (plVar9 == (long *)0x0) {
                if (lVar17 != 0) {
                  free(*(void **)(lVar17 + -8));
                }
              }
              else {
                (**(code **)(*plVar9 + 8))();
              }
            }
          }
          *(undefined8 *)((long)local_540.params + lVar12 + -0x10) = 0;
          *(undefined8 *)((long)(local_540.params + -1) + 0x38 + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].loaded + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.allocator + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.refcount + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.elemsize + lVar12) = 0;
          lVar12 = lVar12 + -0x40;
        } while (lVar12 != -0x28);
        if (0 < this->num_output) {
          pvVar13 = top_blob->data;
          local_558 = (this->weight_data).data;
          local_560 = local_5d8;
          iVar16 = 0;
          lVar12 = 0;
          do {
            iVar22 = 0;
            if (0 < (int)uVar2) {
              lVar17 = (long)iVar16 + (long)local_558;
              uVar19 = 0;
              iVar22 = 0;
              uVar23 = local_5d8;
              do {
                if (0 < (int)uVar20) {
                  uVar14 = 0;
                  do {
                    iVar22 = iVar22 + (int)*(char *)(lVar17 + uVar14) *
                                      (int)*(char *)(uVar23 + uVar14);
                    uVar14 = uVar14 + 1;
                  } while (uVar20 != uVar14);
                }
                uVar19 = uVar19 + 1;
                lVar17 = lVar17 + (int)uVar20;
                uVar23 = uVar23 + local_5a8 * local_5c8;
              } while (uVar19 != uVar2);
            }
            *(int *)((long)pvVar13 + lVar12 * 4) = iVar22;
            lVar12 = lVar12 + 1;
            iVar16 = iVar16 + uVar20 * uVar2;
          } while (lVar12 < this->num_output);
        }
        fVar24 = this->weight_data_int8_scale;
        fVar1 = this->bottom_blob_int8_scale;
        ParamDict::ParamDict(&local_540);
        ParamDict::set(&local_540,0,1.0 / (fVar24 * fVar1));
        ParamDict::set(&local_540,1,this->bias_term);
        ParamDict::set(&local_540,2,this->num_output);
        (*this->dequantize->_vptr_Layer[2])(this->dequantize,&local_540);
        local_598.dims = 0;
        local_598.w = 0;
        local_598.h = 0;
        local_598.c = 0;
        local_598.elemsize = 0;
        local_598.allocator = (Allocator *)0x0;
        local_598.data = (void *)0x0;
        local_598.refcount = (int *)0x0;
        local_598.cstep = 0;
        if (&local_598 != &this->bias_data) {
          piVar8 = (this->bias_data).refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          local_598.data = (this->bias_data).data;
          local_598.refcount = (this->bias_data).refcount;
          local_598.elemsize = (this->bias_data).elemsize;
          local_598.allocator = (this->bias_data).allocator;
          local_598.dims = (this->bias_data).dims;
          local_598.w = (this->bias_data).w;
          local_598.h = (this->bias_data).h;
          local_598.c = (this->bias_data).c;
          local_598.cstep = (this->bias_data).cstep;
        }
        pLVar10 = this->dequantize;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_550,&local_598);
        (*pLVar10->_vptr_Layer[3])(pLVar10,&local_550);
        (*this->dequantize->_vptr_Layer[7])(this->dequantize,top_blob,opt);
        if (local_598.refcount != (int *)0x0) {
          LOCK();
          *local_598.refcount = *local_598.refcount + -1;
          UNLOCK();
          if (*local_598.refcount == 0) {
            if (local_598.allocator == (Allocator *)0x0) {
              if (local_598.data != (void *)0x0) {
                free(*(void **)((long)local_598.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_598.allocator + 8))();
            }
          }
        }
        lVar12 = 0x4d8;
        do {
          piVar8 = *(int **)((long)(local_540.params + -1) + 0x38 + lVar12);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              lVar17 = *(long *)((long)local_540.params + lVar12 + -0x10);
              plVar9 = *(long **)((long)&local_540.params[0].v.data + lVar12);
              if (plVar9 == (long *)0x0) {
                if (lVar17 != 0) {
                  free(*(void **)(lVar17 + -8));
                }
              }
              else {
                (**(code **)(*plVar9 + 8))();
              }
            }
          }
          *(undefined8 *)((long)local_540.params + lVar12 + -0x10) = 0;
          *(undefined8 *)((long)(local_540.params + -1) + 0x38 + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].loaded + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.allocator + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.refcount + lVar12) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.elemsize + lVar12) = 0;
          lVar12 = lVar12 + -0x40;
        } while (lVar12 != -0x28);
        iVar16 = 0;
        if (piStack_5d0 == (int *)0x0) {
          return 0;
        }
      }
      LOCK();
      *piStack_5d0 = *piStack_5d0 + -1;
      UNLOCK();
      if (*piStack_5d0 != 0) {
        return iVar16;
      }
      if (local_5c0 == (Allocator *)0x0) {
        if (local_5d8 != 0) {
          free(*(void **)(local_5d8 - 8));
          return iVar16;
        }
        return iVar16;
      }
      (**(code **)(*(long *)local_5c0 + 8))();
      return iVar16;
    }
  }
  return -100;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->forward(bottom_blob, bottom_blob_int8, opt);
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_int8.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;
        }

        // dequantize, reverse scale inplace
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));

            dequantize->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = sum;
    }

    return 0;
}